

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::operator+=(path *this,value_type *x)

{
  format fmt;
  long *plVar1;
  allocator<char> local_59;
  impl_string_type local_58;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,x,&local_59);
  plVar1 = local_38;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_58,local_38,local_30 + (long)local_38);
  fmt = (format)plVar1;
  postprocess_path_with_format(&local_58,fmt);
  postprocess_path_with_format(&local_58,fmt);
  std::__cxx11::string::_M_append((char *)this,(ulong)local_58._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return this;
}

Assistant:

GHC_INLINE path& path::operator+=(const value_type* x)
{
    return concat(string_type(x));
}